

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

bool __thiscall
QMetaMethod::invoke(QMetaMethod *this,QObject *object,ConnectionType connectionType,
                   QGenericReturnArgument returnValue,QGenericArgument val0,QGenericArgument val1,
                   QGenericArgument val2,QGenericArgument val3,QGenericArgument val4,
                   QGenericArgument val5,QGenericArgument val6,QGenericArgument val7,
                   QGenericArgument val8,QGenericArgument val9)

{
  long lVar1;
  QMetaMethod self;
  QMetaObject *pQVar2;
  Data DVar3;
  char **typeNames_00;
  QMetaTypeInterface **metaTypes;
  size_t sVar4;
  long in_RSI;
  void **in_RDI;
  long in_FS_OFFSET;
  int paramCount;
  void *param [11];
  char *typeNames [11];
  char *in_stack_fffffffffffffe90;
  int local_108;
  void **parameters;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  bool bVar5;
  QGenericArgument local_d8 [16];
  void *local_c8;
  void *local_c0;
  void *local_b8;
  void *local_b0;
  void *local_a8;
  void *local_a0;
  void *local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  char *local_68;
  char *local_60;
  char *local_58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI == 0) || (*in_RDI == (void *)0x0)) {
    bVar5 = false;
  }
  else {
    parameters = in_RDI;
    memset(&local_68,0xaa,0x58);
    local_68 = QGenericArgument::name(local_d8);
    local_60 = QGenericArgument::name((QGenericArgument *)&stack0x00000008);
    local_58 = QGenericArgument::name((QGenericArgument *)&stack0x00000018);
    pQVar2 = (QMetaObject *)QGenericArgument::name((QGenericArgument *)&stack0x00000028);
    DVar3.d = (uint *)QGenericArgument::name((QGenericArgument *)&stack0x00000038);
    QGenericArgument::name((QGenericArgument *)&stack0x00000048);
    QGenericArgument::name((QGenericArgument *)&stack0x00000058);
    typeNames_00 = (char **)QGenericArgument::name((QGenericArgument *)&stack0x00000068);
    metaTypes = (QMetaTypeInterface **)QGenericArgument::name((QGenericArgument *)&object);
    QGenericArgument::name((QGenericArgument *)&stack0x00000088);
    QGenericArgument::name((QGenericArgument *)&stack0x00000098);
    memset(&local_c8,0xaa,0x58);
    local_c8 = QGenericArgument::data(local_d8);
    local_c0 = QGenericArgument::data((QGenericArgument *)&stack0x00000008);
    local_b8 = QGenericArgument::data((QGenericArgument *)&stack0x00000018);
    local_b0 = QGenericArgument::data((QGenericArgument *)&stack0x00000028);
    local_a8 = QGenericArgument::data((QGenericArgument *)&stack0x00000038);
    local_a0 = QGenericArgument::data((QGenericArgument *)&stack0x00000048);
    local_98 = QGenericArgument::data((QGenericArgument *)&stack0x00000058);
    local_90 = QGenericArgument::data((QGenericArgument *)&stack0x00000068);
    local_88 = QGenericArgument::data((QGenericArgument *)&object);
    local_80 = QGenericArgument::data((QGenericArgument *)&stack0x00000088);
    local_78 = QGenericArgument::data((QGenericArgument *)&stack0x00000098);
    local_108 = 1;
    while ((local_108 < 0xb && (sVar4 = qstrlen(in_stack_fffffffffffffe90), sVar4 != 0))) {
      local_108 = local_108 + 1;
    }
    self.data.d = DVar3.d;
    self.mobj = pQVar2;
    bVar5 = invokeImpl(self,in_RDI[1],(ConnectionType)((ulong)*in_RDI >> 0x20),
                       CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),parameters,
                       typeNames_00,metaTypes);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QMetaMethod::invoke(QObject *object,
                         Qt::ConnectionType connectionType,
                         QGenericReturnArgument returnValue,
                         QGenericArgument val0,
                         QGenericArgument val1,
                         QGenericArgument val2,
                         QGenericArgument val3,
                         QGenericArgument val4,
                         QGenericArgument val5,
                         QGenericArgument val6,
                         QGenericArgument val7,
                         QGenericArgument val8,
                         QGenericArgument val9) const
{
    if (!object || !mobj)
        return false;

    // check argument count (we don't allow invoking a method if given too few arguments)
    const char *typeNames[] = {
        returnValue.name(),
        val0.name(),
        val1.name(),
        val2.name(),
        val3.name(),
        val4.name(),
        val5.name(),
        val6.name(),
        val7.name(),
        val8.name(),
        val9.name()
    };
    void *param[] = {
        returnValue.data(),
        val0.data(),
        val1.data(),
        val2.data(),
        val3.data(),
        val4.data(),
        val5.data(),
        val6.data(),
        val7.data(),
        val8.data(),
        val9.data()
    };

    int paramCount;
    for (paramCount = 1; paramCount < MaximumParamCount; ++paramCount) {
        if (qstrlen(typeNames[paramCount]) <= 0)
            break;
    }
    return invokeImpl(*this, object, connectionType, paramCount, param, typeNames, nullptr);
}